

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
::~sherwood_v3_table
          (sherwood_v3_table<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
           *this)

{
  clear(this);
  deallocate_data(this,this->entries,this->num_slots_minus_one,this->max_lookups);
  return;
}

Assistant:

~sherwood_v3_table()
    {
        clear();
        deallocate_data(entries, num_slots_minus_one, max_lookups);
    }